

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O0

void __thiscall wasm::ReorderGlobals::run(ReorderGlobals *this,Module *module)

{
  bool bVar1;
  size_type sVar2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_00;
  reference this_01;
  pointer __k;
  PassRunner *pPVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  iterator __first;
  iterator __last;
  Name NVar6;
  mapped_type local_290;
  size_type index;
  Name global_1;
  Iterator __end2_1;
  Iterator __begin2_1;
  DependencySort *__range2_1;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  sortedIndexes;
  UseCountScanner scanner;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  NameCountMap counts;
  Module *module_local;
  ReorderGlobals *this_local;
  
  counts._M_h._M_single_bucket = (__node_base_ptr)module;
  sVar2 = std::
          vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ::size(&module->globals);
  if ((0x7f < sVar2) || ((this->always & 1U) != 0)) {
    std::
    unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
    ::unordered_map((unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
                     *)&__range2);
    this_00 = (vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               *)(counts._M_h._M_single_bucket + 6);
    __end2 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(this_00);
    global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
             std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2);
      __k = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_01);
      std::
      unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
      ::operator[]((unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
                    *)&__range2,(key_type *)__k);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2);
    }
    UseCountScanner::UseCountScanner
              ((UseCountScanner *)&sortedIndexes._M_h._M_single_bucket,(NameCountMap *)&__range2);
    pPVar3 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
           *)&sortedIndexes._M_h._M_single_bucket,pPVar3,(Module *)counts._M_h._M_single_bucket);
    pPVar3 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                       *)&sortedIndexes._M_h._M_single_bucket,pPVar3,
                      (Module *)counts._M_h._M_single_bucket);
    std::
    unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
    ::unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                     *)&__range2_1);
    run(wasm::Module*)::DependencySort::DependencySort(wasm::Module&,std::unordered_map<wasm::
    Name,std::atomic<unsigned_int>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
    allocator<std::pair<wasm::Name_const,std::atomic<unsigned_int>_>_>_>_const__
              (&__begin2_1,(Module *)counts._M_h._M_single_bucket,(NameCountMap *)&__range2);
    __end2_1 = TopologicalSort<wasm::Name,_DependencySort>::begin
                         ((TopologicalSort<wasm::Name,_DependencySort> *)&__begin2_1);
    global_1.super_IString.str._M_str =
         (char *)TopologicalSort<wasm::Name,_DependencySort>::end
                           ((TopologicalSort<wasm::Name,_DependencySort> *)&__begin2_1);
    while (bVar1 = TopologicalSort<wasm::Name,_DependencySort>::Iterator::operator!=
                             (&__end2_1,(Iterator *)&global_1.super_IString.str._M_str), bVar1) {
      NVar6 = TopologicalSort<wasm::Name,_DependencySort>::Iterator::operator*(&__end2_1);
      global_1.super_IString.str._M_len = NVar6.super_IString.str._M_str;
      index = NVar6.super_IString.str._M_len;
      sVar4 = std::
              unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
              ::size((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                      *)&__range2_1);
      local_290 = (mapped_type)sVar4;
      pmVar5 = std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                             *)&__range2_1,(key_type *)&index);
      *pmVar5 = local_290;
      TopologicalSort<wasm::Name,_DependencySort>::Iterator::operator++(&__end2_1);
    }
    run::DependencySort::~DependencySort((DependencySort *)&__begin2_1);
    __first = std::
              vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ::begin((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                       *)(counts._M_h._M_single_bucket + 6));
    __last = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::end((vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    *)(counts._M_h._M_single_bucket + 6));
    std::
    sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>*,std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>>,wasm::ReorderGlobals::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&,std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&)_1_>
              ((__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                )__last._M_current,
               (unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                *)&__range2_1);
    Module::updateMaps((Module *)counts._M_h._M_single_bucket);
    std::
    unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                      *)&__range2_1);
    UseCountScanner::~UseCountScanner((UseCountScanner *)&sortedIndexes._M_h._M_single_bucket);
    std::
    unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
                      *)&__range2);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->globals.size() < 128 && !always) {
      // The module has so few globals that they all fit in a single-byte U32LEB
      // value, so no reordering we can do can actually decrease code size. Note
      // that this is the common case with wasm MVP modules where the only
      // globals are typically the stack pointer and perhaps a handful of others
      // (however, features like wasm GC there may be a great many globals).
      return;
    }

    NameCountMap counts;
    // Fill in info, as we'll operate on it in parallel.
    for (auto& global : module->globals) {
      counts[global->name];
    }

    // Count uses.
    UseCountScanner scanner(counts);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Do a toplogical sort to ensure we keep dependencies before the things
    // that need them. For example, if $b's definition depends on $a then $b
    // must appear later:
    //
    //   (global $a i32 (i32.const 10))
    //   (global $b i32 (global.get $a)) ;; $b depends on $a
    //
    struct DependencySort : TopologicalSort<Name, DependencySort> {
      Module& wasm;
      const NameCountMap& counts;

      std::unordered_map<Name, std::vector<Name>> deps;

      DependencySort(Module& wasm, const NameCountMap& counts)
        : wasm(wasm), counts(counts) {
        // Sort a list of global names by their counts.
        auto sort = [&](std::vector<Name>& globals) {
          std::stable_sort(
            globals.begin(), globals.end(), [&](const Name& a, const Name& b) {
              return counts.at(a) < counts.at(b);
            });
        };

        // Sort the globals.
        std::vector<Name> sortedNames;
        for (auto& global : wasm.globals) {
          sortedNames.push_back(global->name);
        }
        sort(sortedNames);

        // Everything is a root (we need to emit all globals).
        for (auto global : sortedNames) {
          push(global);
        }

        // The dependencies are the globals referred to.
        for (auto& global : wasm.globals) {
          if (global->imported()) {
            continue;
          }
          std::vector<Name> vec;
          for (auto* get : FindAll<GlobalGet>(global->init).list) {
            vec.push_back(get->name);
          }
          sort(vec);
          deps[global->name] = std::move(vec);
        }
      }

      void pushPredecessors(Name global) {
        for (auto pred : deps[global]) {
          push(pred);
        }
      }
    };

    std::unordered_map<Name, Index> sortedIndexes;
    for (auto global : DependencySort(*module, counts)) {
      auto index = sortedIndexes.size();
      sortedIndexes[global] = index;
    }

    std::sort(
      module->globals.begin(),
      module->globals.end(),
      [&](const std::unique_ptr<Global>& a, const std::unique_ptr<Global>& b) {
        return sortedIndexes[a->name] < sortedIndexes[b->name];
      });

    module->updateMaps();
  }